

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::MergeFrom
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  MethodOptions *this_00;
  MethodOptions *from_00;
  InternalMetadataWithArena *this_01;
  LogFinisher local_c5;
  uint32 cached_has_bits;
  byte local_b1;
  LogMessage local_b0;
  MethodDescriptorProto *local_78;
  MethodDescriptorProto *from_local;
  MethodDescriptorProto *this_local;
  InternalMetadataWithArena *local_60;
  InternalMetadataWithArena *local_58;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_b1 = 0;
  local_78 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x1ec6);
    local_b1 = 1;
    other = internal::LogMessage::operator<<(&local_b0,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_c5,other);
  }
  if ((local_b1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b0);
  }
  this_01 = &this->_internal_metadata_;
  this_local = (MethodDescriptorProto *)&local_78->_internal_metadata_;
  local_60 = this_01;
  local_58 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom(this_01,&local_28->unknown_fields);
  }
  local_38 = &local_78->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_name(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault(&this->name_,psVar2,(local_78->name_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      set_has_input_type(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->input_type_,psVar2,(local_78->input_type_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      set_has_output_type(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->output_type_,psVar2,(local_78->output_type_).ptr_);
    }
    if ((uVar1 & 8) != 0) {
      this_00 = mutable_options(this);
      from_00 = options(local_78);
      MethodOptions::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 0x10) != 0) {
      this->client_streaming_ = (bool)(local_78->client_streaming_ & 1);
    }
    if ((uVar1 & 0x20) != 0) {
      this->server_streaming_ = (bool)(local_78->server_streaming_ & 1);
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void MethodDescriptorProto::MergeFrom(const MethodDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.MethodDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 63u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_input_type();
      input_type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.input_type_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_output_type();
      output_type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.output_type_);
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_options()->::google::protobuf::MethodOptions::MergeFrom(from.options());
    }
    if (cached_has_bits & 0x00000010u) {
      client_streaming_ = from.client_streaming_;
    }
    if (cached_has_bits & 0x00000020u) {
      server_streaming_ = from.server_streaming_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}